

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

void usage(char *progname)

{
  undefined8 in_RDI;
  
  printf("Usage: %s [options] [host]\nOptions:\n  -c <file>    specifies the certificate chain file (PEM format)\n  -k <file>    specifies the private key file (PEM format)\n  -p <number>  specifies the port number (default: 4433)\n  -h           prints this help\n\nWhen both `-c` and `-k` is specified, runs as a server.  Otherwise, runs as a\nclient connecting to host:port.  If omitted, host defaults to 127.0.0.1.\n"
         ,in_RDI);
  exit(0);
}

Assistant:

static void usage(const char *progname)
{
    printf("Usage: %s [options] [host]\n"
           "Options:\n"
           "  -c <file>    specifies the certificate chain file (PEM format)\n"
           "  -k <file>    specifies the private key file (PEM format)\n"
           "  -p <number>  specifies the port number (default: 4433)\n"
           "  -h           prints this help\n"
           "\n"
           "When both `-c` and `-k` is specified, runs as a server.  Otherwise, runs as a\n"
           "client connecting to host:port.  If omitted, host defaults to 127.0.0.1.\n",
           progname);
    exit(0);
}